

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_interaction.cpp
# Opt level: O2

void ClientObituary(AActor *self,AActor *inflictor,AActor *attacker,int dmgflags)

{
  player_t *ppVar1;
  AWeapon *this;
  FName FVar2;
  AActor *pAVar3;
  bool bVar4;
  char cVar5;
  uint uVar6;
  char *pcVar7;
  PClass *pPVar8;
  char *victim;
  char *killer;
  AActor *pAVar9;
  int local_444;
  char *local_440;
  char gendermessage [1024];
  
  ppVar1 = self->player;
  if (ppVar1 == (player_t *)0x0) {
    return;
  }
  if (ppVar1->mo != (APlayerPawn *)self) {
    return;
  }
  if (!show_obituaries.Value) {
    return;
  }
  local_444 = userinfo_t::GetGender(&ppVar1->userinfo);
  if (((inflictor != (AActor *)0x0) && (inflictor->player != (player_t *)0x0)) &&
     (inflictor->player->mo != (APlayerPawn *)inflictor)) {
    MeansOfDeath.Index = 0;
  }
  FVar2.Index = MeansOfDeath.Index;
  if ((attacker == (AActor *)0x0) || (attacker->player != (player_t *)0x0)) {
    if (MeansOfDeath.Index != 0xc1) {
      bVar4 = AnnounceKill(attacker,self);
      if (bVar4) {
        return;
      }
      goto LAB_00406d57;
    }
    bVar4 = AnnounceTelefrag(attacker,self);
    if (bVar4) {
      return;
    }
    local_440 = (char *)0x0;
  }
  else {
LAB_00406d57:
    local_440 = (char *)0x0;
    switch(FVar2.Index) {
    case 0xbf:
      local_440 = "OB_WATER";
      break;
    case 0xc0:
      local_440 = "OB_SLIME";
      break;
    case 0xc1:
      break;
    case 0xc2:
      local_440 = "OB_FALLING";
      break;
    case 0xc3:
      local_440 = "OB_SUICIDE";
      break;
    case 0xc4:
      local_440 = "OB_EXIT";
      break;
    default:
      if (FVar2.Index == 0x90) {
        local_440 = "OB_CRUSH";
      }
      else if ((FVar2.Index == 0xa4) && (local_440 = (char *)0x0, attacker == (AActor *)0x0)) {
        local_440 = "OB_LAVA";
      }
    }
  }
  if (((inflictor == (AActor *)0x0) || (inflictor->player == (player_t *)0x0)) ||
     (inflictor->player->mo == (APlayerPawn *)inflictor)) {
    if (local_440 != (char *)0x0) goto LAB_00406df2;
    local_440 = (char *)0x0;
    pcVar7 = (char *)0x0;
  }
  else {
    local_440 = "OB_VOODOO";
LAB_00406df2:
    pcVar7 = FStringTable::operator()(&GStrings,local_440);
  }
  if ((attacker != (AActor *)0x0) && (pcVar7 == (char *)0x0)) {
    if (attacker == self) {
      pcVar7 = "OB_KILLEDSELF";
LAB_00406e42:
      pcVar7 = FStringTable::operator()(&GStrings,pcVar7);
    }
    else {
      if (attacker->player == (player_t *)0x0) {
        if (FVar2.Index == 0x89) {
          pPVar8 = DObject::GetClass((DObject *)attacker);
          if (*(int *)(*(long *)&pPVar8[1].super_PNativeStruct.super_PStruct.super_PNamedType.
                                 super_PCompoundType.super_PType.MemberOnly + -0xc) != 0) {
            pPVar8 = DObject::GetClass((DObject *)attacker);
            pcVar7 = *(char **)&pPVar8[1].super_PNativeStruct.super_PStruct.super_PNamedType.
                                super_PCompoundType.super_PType.MemberOnly;
            goto LAB_00406e4a;
          }
        }
        else if (FVar2.Index == 0xc1) {
          pcVar7 = "OB_MONTELEFRAG";
          goto LAB_00406e42;
        }
        pPVar8 = DObject::GetClass((DObject *)attacker);
        if (*(int *)(*(long *)((long)&pPVar8[1].super_PNativeStruct.super_PStruct.super_PNamedType.
                                      super_PCompoundType.super_PType.Symbols.Symbols + 0x10) + -0xc
                    ) != 0) {
          pPVar8 = DObject::GetClass((DObject *)attacker);
          pcVar7 = *(char **)((long)&pPVar8[1].super_PNativeStruct.super_PStruct.super_PNamedType.
                                     super_PCompoundType.super_PType.Symbols.Symbols + 0x10);
          goto LAB_00406e4a;
        }
      }
      pcVar7 = (char *)0x0;
    }
  }
LAB_00406e4a:
  pAVar3 = self;
  pAVar9 = self;
  if ((attacker == (AActor *)0x0) || (pcVar7 != (char *)0x0)) {
LAB_00406edf:
    self = pAVar3;
    pAVar3 = self;
    if (pcVar7 == (char *)0x0) goto LAB_00407068;
LAB_0040704a:
    self = pAVar3;
    cVar5 = *pcVar7;
    if (cVar5 != '$') goto LAB_00407085;
    pcVar7 = FStringTable::operator[](&GStrings,pcVar7 + 1);
    if (pcVar7 == (char *)0x0) goto LAB_00407068;
  }
  else {
    if (attacker->player != (player_t *)0x0) {
      if ((self->player != attacker->player) && (bVar4 = AActor::IsTeammate(self,attacker), bVar4))
      {
        local_444 = userinfo_t::GetGender(&attacker->player->userinfo);
        uVar6 = FRandom::operator()(&pr_obituary);
        mysnprintf(gendermessage,0x400,"OB_FRIENDLY%c",(ulong)((uVar6 & 3) + 0x31));
        pcVar7 = FStringTable::operator()(&GStrings,gendermessage);
        pAVar3 = attacker;
        pAVar9 = attacker;
        goto LAB_00406edf;
      }
      if ((FVar2.Index != 0xc1) ||
         (pcVar7 = FStringTable::operator()(&GStrings,"OB_MPTELEFRAG"), pAVar3 = attacker,
         pcVar7 == (char *)0x0)) {
        if ((inflictor != (AActor *)0x0) &&
           (pPVar8 = DObject::GetClass((DObject *)inflictor),
           *(int *)(*(long *)((long)&pPVar8[1].super_PNativeStruct.super_PStruct.super_PNamedType.
                                     super_PCompoundType.super_PType.Symbols.Symbols + 0x10) + -0xc)
           != 0)) {
          pPVar8 = DObject::GetClass((DObject *)inflictor);
          pcVar7 = *(char **)((long)&pPVar8[1].super_PNativeStruct.super_PStruct.super_PNamedType.
                                     super_PCompoundType.super_PType.Symbols.Symbols + 0x10);
          pAVar3 = attacker;
          if (pcVar7 != (char *)0x0) goto LAB_0040704a;
        }
        if (((dmgflags & 0x20U) != 0) &&
           (this = attacker->player->ReadyWeapon, this != (AWeapon *)0x0)) {
          pPVar8 = DObject::GetClass((DObject *)this);
          pcVar7 = *(char **)((long)&pPVar8[1].super_PNativeStruct.super_PStruct.super_PNamedType.
                                     super_PCompoundType.super_PType.Symbols.Symbols + 0x10);
          pAVar3 = attacker;
          if (pcVar7 != (char *)0x0) goto LAB_0040704a;
        }
        if (FVar2.Index == 200) {
          local_440 = "OB_MPBFG_SPLASH";
LAB_00407032:
          pcVar7 = FStringTable::operator()(&GStrings,local_440);
          pAVar3 = attacker;
          if (pcVar7 != (char *)0x0) goto LAB_0040704a;
        }
        else {
          if (FVar2.Index == 0xc5) {
            local_440 = "OB_RAILGUN";
            goto LAB_00407032;
          }
          if (local_440 != (char *)0x0) goto LAB_00407032;
        }
        pPVar8 = DObject::GetClass((DObject *)attacker);
        pcVar7 = *(char **)((long)&pPVar8[1].super_PNativeStruct.super_PStruct.super_PNamedType.
                                   super_PCompoundType.super_PType.Symbols.Symbols + 0x10);
        pAVar3 = attacker;
        goto LAB_00406edf;
      }
      goto LAB_0040704a;
    }
LAB_00407068:
    pcVar7 = FStringTable::operator()(&GStrings,"OB_DEFAULT");
    if (pcVar7 == (char *)0x0) {
      return;
    }
  }
  cVar5 = *pcVar7;
LAB_00407085:
  if (cVar5 != '\0') {
    victim = userinfo_t::GetName(&pAVar9->player->userinfo);
    killer = userinfo_t::GetName(&self->player->userinfo);
    SexMessage(pcVar7,gendermessage,local_444,victim,killer);
    Printf(1,"%s\n",gendermessage);
  }
  return;
}

Assistant:

void ClientObituary (AActor *self, AActor *inflictor, AActor *attacker, int dmgflags)
{
	FName mod;
	const char *message;
	const char *messagename;
	char gendermessage[1024];
	int  gender;

	// No obituaries for non-players, voodoo dolls or when not wanted
	if (self->player == NULL || self->player->mo != self || !show_obituaries)
		return;

	gender = self->player->userinfo.GetGender();

	// Treat voodoo dolls as unknown deaths
	if (inflictor && inflictor->player && inflictor->player->mo != inflictor)
		MeansOfDeath = NAME_None;

	mod = MeansOfDeath;
	message = NULL;
	messagename = NULL;

	if (attacker == NULL || attacker->player != NULL)
	{
		if (mod == NAME_Telefrag)
		{
			if (AnnounceTelefrag (attacker, self))
				return;
		}
		else
		{
			if (AnnounceKill (attacker, self))
				return;
		}
	}

	switch (mod)
	{
	case NAME_Suicide:		messagename = "OB_SUICIDE";		break;
	case NAME_Falling:		messagename = "OB_FALLING";		break;
	case NAME_Crush:		messagename = "OB_CRUSH";		break;
	case NAME_Exit:			messagename = "OB_EXIT";		break;
	case NAME_Drowning:		messagename = "OB_WATER";		break;
	case NAME_Slime:		messagename = "OB_SLIME";		break;
	case NAME_Fire:			if (attacker == NULL) messagename = "OB_LAVA";		break;
	}

	// Check for being killed by a voodoo doll.
	if (inflictor && inflictor->player && inflictor->player->mo != inflictor)
	{
		messagename = "OB_VOODOO";
	}

	if (messagename != NULL)
		message = GStrings(messagename);

	if (attacker != NULL && message == NULL)
	{
		if (attacker == self)
		{
			message = GStrings("OB_KILLEDSELF");
		}
		else if (attacker->player == NULL)
		{
			if (mod == NAME_Telefrag)
			{
				message = GStrings("OB_MONTELEFRAG");
			}
			else if (mod == NAME_Melee && attacker->GetClass()->HitObituary.IsNotEmpty())
			{
				message = attacker->GetClass()->HitObituary;
			}
			else if (attacker->GetClass()->Obituary.IsNotEmpty())
			{
				message = attacker->GetClass()->Obituary;
			}
		}
	}

	if (message == NULL && attacker != NULL && attacker->player != NULL)
	{
		if (self->player != attacker->player && self->IsTeammate(attacker))
		{
			self = attacker;
			gender = self->player->userinfo.GetGender();
			mysnprintf (gendermessage, countof(gendermessage), "OB_FRIENDLY%c", '1' + (pr_obituary() & 3));
			message = GStrings(gendermessage);
		}
		else
		{
			if (mod == NAME_Telefrag) message = GStrings("OB_MPTELEFRAG");
			if (message == NULL)
			{
				if (inflictor != NULL && inflictor->GetClass()->Obituary.IsNotEmpty())
				{
					message = inflictor->GetClass()->Obituary;
				}
				if (message == NULL && (dmgflags & DMG_PLAYERATTACK) && attacker->player->ReadyWeapon != NULL)
				{
					message = attacker->player->ReadyWeapon->GetClass()->Obituary;
				}
				if (message == NULL)
				{
					switch (mod)
					{
					case NAME_BFGSplash:	messagename = "OB_MPBFG_SPLASH";	break;
					case NAME_Railgun:		messagename = "OB_RAILGUN";			break;
					}
					if (messagename != NULL)
						message = GStrings(messagename);
				}
				if (message == NULL)
				{
					message = attacker->GetClass()->Obituary;
				}
			}
		}
	}
	else attacker = self;	// for the message creation

	if (message != NULL && message[0] == '$') 
	{
		message = GStrings[message+1];
	}

	if (message == NULL)
	{
		message = GStrings("OB_DEFAULT");
	}

	// [CK] Don't display empty strings
	if (message == NULL || strlen(message) <= 0)
		return;
		
	SexMessage (message, gendermessage, gender,
		self->player->userinfo.GetName(), attacker->player->userinfo.GetName());
	Printf (PRINT_MEDIUM, "%s\n", gendermessage);
}